

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NodeSopToCubes(Abc_Obj_t *pNodeOld,Abc_Ntk_t *pNtkNew,int fXor)

{
  byte *pSop;
  Mem_Flex_t *pMan;
  byte bVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pFanin;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  
  pSop = (byte *)(pNodeOld->field_5).pData;
  iVar6 = (pNodeOld->vFanins).nSize;
  iVar2 = Abc_SopGetCubeNum((char *)pSop);
  if (iVar2 < 2) {
    pAVar3 = Abc_NtkDupObj(pNtkNew,pNodeOld,0);
    if (0 < (pNodeOld->vFanins).nSize) {
      lVar8 = 0;
      do {
        Abc_ObjAddFanin(pAVar3,*(Abc_Obj_t **)
                                ((long)pNodeOld->pNtk->vObjs->pArray
                                       [(pNodeOld->vFanins).pArray[lVar8]] + 0x40));
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pNodeOld->vFanins).nSize);
    }
    if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != pAVar3) {
      __assert_fail("pNodeOld->pCopy == pNodeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0x9ee,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
  }
  else {
    pAVar3 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    iVar2 = Abc_SopGetCubeNum((char *)pSop);
    if (fXor == 0) {
      pcVar4 = Abc_SopCreateOr(pMan,iVar2,(int *)0x0);
    }
    else {
      pcVar4 = Abc_SopCreateXorSpecial(pMan,iVar2);
    }
    (pAVar3->field_5).pData = pcVar4;
    bVar1 = *pSop;
    if (bVar1 != 0) {
      iVar6 = iVar6 + 3;
      pbVar7 = pSop + 1;
      pbVar9 = pSop;
      do {
        iVar2 = 0;
        pbVar5 = pbVar7;
        while ((bVar1 & 0xdf) != 0) {
          iVar2 = iVar2 + (uint)((bVar1 & 0xfe) == 0x30);
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        }
        if (iVar2 == 0) {
          pFanin = Abc_NtkCreateNodeConst1(pNtkNew);
        }
        else {
          pFanin = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
          pcVar4 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,iVar2,(int *)0x0);
          (pFanin->field_5).pData = pcVar4;
          iVar2 = 0;
          for (lVar8 = 0; bVar1 = pbVar9[lVar8], (bVar1 & 0xdf) != 0; lVar8 = lVar8 + 1) {
            if (0xfd < (byte)(bVar1 - 0x32)) {
              Abc_ObjAddFanin(pFanin,*(Abc_Obj_t **)
                                      ((long)pNodeOld->pNtk->vObjs->pArray
                                             [(pNodeOld->vFanins).pArray[lVar8]] + 0x40));
              if (bVar1 == 0x30) {
                Abc_SopComplementVar((char *)(pFanin->field_5).pData,iVar2);
              }
              iVar2 = iVar2 + 1;
            }
          }
        }
        Abc_ObjAddFanin(pAVar3,pFanin);
        bVar1 = pbVar9[iVar6];
        pbVar9 = pbVar9 + iVar6;
        pbVar7 = pbVar7 + iVar6;
      } while (bVar1 != 0);
    }
    iVar6 = Abc_SopIsComplement((char *)pSop);
    if (iVar6 != 0) {
      Abc_SopComplement((char *)(pAVar3->field_5).pData);
    }
    if ((pNodeOld->field_6).pTemp != (void *)0x0) {
      __assert_fail("pNodeOld->pCopy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0xa18,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
    (pNodeOld->field_6).pCopy = pAVar3;
  }
  return;
}

Assistant:

void Abc_NodeSopToCubes( Abc_Obj_t * pNodeOld, Abc_Ntk_t * pNtkNew, int fXor )
{
    Abc_Obj_t * pNodeOr, * pNodeNew, * pFanin;
    char * pCube, * pSop = (char *)pNodeOld->pData;
    int v, Value, nVars = Abc_ObjFaninNum(pNodeOld), nFanins;
    // create the root node
    if ( Abc_SopGetCubeNum(pSop) < 2 )
    {
        pNodeNew = Abc_NtkDupObj( pNtkNew, pNodeOld, 0 );
        Abc_ObjForEachFanin( pNodeOld, pFanin, v )
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        assert( pNodeOld->pCopy == pNodeNew );
        return;
    }
    // add the OR gate
    pNodeOr = Abc_NtkCreateNode( pNtkNew );
    if ( fXor )
        pNodeOr->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop) );
    else 
        pNodeOr->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop), NULL );
    // check the logic function of the node
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
            if ( Value == '0' || Value == '1' )
                nFanins++;
        if ( nFanins == 0 ) // const1 cube in ESOP
        {
            pNodeNew = Abc_NtkCreateNodeConst1( pNtkNew );
            Abc_ObjAddFanin( pNodeOr, pNodeNew );
            continue;
        }
        assert( nFanins > 0 );
        // create node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, nFanins, NULL );
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value != '0' && Value != '1' )
                continue;
            Abc_ObjAddFanin( pNodeNew, Abc_ObjFanin(pNodeOld, v)->pCopy );
            if ( Value == '0' )
                Abc_SopComplementVar( (char *)pNodeNew->pData, nFanins );
            nFanins++;
        }
        Abc_ObjAddFanin( pNodeOr, pNodeNew );
    }
    // check the complement
    if ( Abc_SopIsComplement(pSop) )
        Abc_SopComplement( (char *)pNodeOr->pData );
    // mark the old node with the new one
    assert( pNodeOld->pCopy == NULL );
    pNodeOld->pCopy = pNodeOr;
}